

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

void introsort_loop(int *a,int n,int lim)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int tmp_2;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  
  if (0x10 < n) {
    do {
      bVar16 = lim == 0;
      lim = lim + -1;
      if (bVar16) {
        uVar10 = (ulong)(uint)n;
        uVar8 = 1;
        do {
          iVar1 = a[uVar8];
          uVar8 = uVar8 + 1;
          uVar14 = uVar8 & 0xffffffff;
          uVar12 = uVar8 & 0xffffffff;
          do {
            iVar13 = (int)uVar14;
            uVar15 = (int)(uVar12 >> 0x1f) + iVar13 >> 1;
            uVar12 = (ulong)uVar15;
            if (iVar1 <= a[(long)(int)uVar15 + -1]) break;
            a[(long)iVar13 + -1] = a[(long)(int)uVar15 + -1];
            a[(long)(int)uVar15 + -1] = iVar1;
            uVar14 = (ulong)uVar15;
          } while (3 < iVar13);
        } while (uVar8 != uVar10);
        iVar1 = *a;
        *a = a[uVar10 - 1];
        a[uVar10 - 1] = iVar1;
        if (n == 2) {
          return;
        }
        do {
          uVar8 = uVar10 - 1;
          uVar15 = 2;
          uVar9 = 1;
          do {
            lVar7 = (long)(int)uVar15;
            uVar11 = uVar15;
            if (lVar7 < (long)uVar8) {
              uVar11 = uVar15 | 1;
              if (a[(long)(int)(uVar15 | 1) + -1] <= a[lVar7 + -1]) {
                uVar11 = uVar15;
              }
              lVar7 = (long)(int)uVar11;
            }
            iVar1 = a[(long)(int)uVar9 + -1];
            if (a[lVar7 + -1] <= iVar1) break;
            a[(long)(int)uVar9 + -1] = a[lVar7 + -1];
            a[lVar7 + -1] = iVar1;
            uVar15 = uVar11 * 2;
            uVar9 = uVar11;
          } while ((long)(int)uVar15 < (long)uVar10);
          iVar1 = *a;
          *a = a[uVar10 - 2];
          a[uVar10 - 2] = iVar1;
          uVar10 = uVar8;
          if (uVar8 == 2) {
            return;
          }
        } while( true );
      }
      iVar1 = *a;
      iVar13 = a[(uint)n >> 1];
      iVar2 = a[(ulong)(uint)n - 1];
      if (iVar13 < iVar1) {
        iVar4 = iVar1;
        if ((iVar2 < iVar1) && (iVar4 = iVar2, iVar2 < iVar13)) {
          iVar4 = iVar13;
        }
      }
      else {
        iVar4 = iVar13;
        if ((iVar2 < iVar13) && (iVar4 = iVar2, iVar2 < iVar1)) {
          iVar4 = iVar1;
        }
      }
      lVar7 = 0;
      uVar10 = (ulong)(uint)n;
      while( true ) {
        lVar5 = (lVar7 << 0x20) + -0x100000000;
        uVar15 = (int)lVar7 - 1;
        lVar7 = (long)(int)lVar7;
        do {
          lVar6 = lVar7;
          lVar5 = lVar5 + 0x100000000;
          iVar1 = a[lVar6];
          lVar7 = lVar6 + 1;
          uVar15 = uVar15 + 1;
        } while (iVar1 <= iVar4);
        uVar10 = (ulong)(int)uVar10;
        do {
          lVar3 = uVar10 - 1;
          uVar10 = uVar10 - 1;
        } while (iVar4 <= a[lVar3]);
        if ((long)uVar10 <= lVar6) break;
        a[lVar6] = a[lVar3];
        a[uVar10] = iVar1;
      }
      introsort_loop((int *)((lVar5 >> 0x1e) + (long)a),n - uVar15,lim);
      n = uVar15;
    } while (0x10 < lVar6);
  }
  return;
}

Assistant:

static void
introsort_loop(int *a, int n, int lim)
{
    int p;
    while (n > 16) {
        if (lim == 0) {
            heap_sort(a, n);
            return;
        }
        --lim;
        p = partition(a, n, median(a[0], a[n/2], a[n-1]));
        introsort_loop(a + p, n - p, lim);
        n = p;
    }
}